

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteCordOutline
          (EpsCopyOutputStream *this,Cord *c,uint8_t *ptr)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint32_t size;
  uint8_t *ptr_local;
  Cord *c_local;
  EpsCopyOutputStream *this_local;
  uint local_c;
  
  sVar1 = absl::lts_20250127::Cord::size(c);
  this_local = (EpsCopyOutputStream *)ptr;
  for (local_c = (uint)sVar1; 0x7f < local_c; local_c = local_c >> 7) {
    *(byte *)&this_local->end_ = (byte)local_c | 0x80;
    this_local = (EpsCopyOutputStream *)((long)&this_local->end_ + 1);
  }
  *(byte *)&this_local->end_ = (byte)local_c;
  puVar2 = WriteCord(this,c,(uint8_t *)((long)&this_local->end_ + 1));
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteCordOutline(const absl::Cord& c, uint8_t* ptr) {
  uint32_t size = c.size();
  ptr = UnsafeWriteSize(size, ptr);
  return WriteCord(c, ptr);
}